

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O3

bool duckdb::GetInternalCValue<bool,duckdb::TryCast>(duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      bVar1 = TryCastCInternal<bool,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_TINYINT:
      bVar1 = TryCastCInternal<signed_char,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_SMALLINT:
      bVar1 = TryCastCInternal<short,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_INTEGER:
      bVar1 = TryCastCInternal<int,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_BIGINT:
      bVar1 = TryCastCInternal<long,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_UTINYINT:
      bVar1 = TryCastCInternal<unsigned_char,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_USMALLINT:
      bVar1 = TryCastCInternal<unsigned_short,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_UINTEGER:
      bVar1 = TryCastCInternal<unsigned_int,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_UBIGINT:
      bVar1 = TryCastCInternal<unsigned_long,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_FLOAT:
      bVar1 = TryCastCInternal<float,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_DOUBLE:
      bVar1 = TryCastCInternal<double,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_TIMESTAMP:
      bVar1 = TryCastCInternal<duckdb::timestamp_t,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_DATE:
      bVar1 = TryCastCInternal<duckdb::date_t,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_TIME:
      bVar1 = TryCastCInternal<duckdb::dtime_t,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_INTERVAL:
      bVar1 = TryCastCInternal<duckdb::interval_t,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_HUGEINT:
      bVar1 = TryCastCInternal<duckdb::hugeint_t,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_VARCHAR:
      bVar1 = TryCastCInternal<char*,bool,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return bVar1;
    case DUCKDB_TYPE_DECIMAL:
      bVar1 = TryCastDecimalCInternal<bool>(result,col,row);
      return bVar1;
    case DUCKDB_TYPE_UHUGEINT:
      bVar1 = TryCastCInternal<duckdb::uhugeint_t,bool,duckdb::TryCast>(result,col,row);
      return bVar1;
    }
  }
  return false;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}